

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestTestHandler.cxx
# Opt level: O0

int anon_unknown.dwarf_1f935c::GetNextRealNumber
              (string *in,double *val,size_type *pos,size_type *pos2)

{
  double *pdVar1;
  size_type sVar2;
  char *pcVar3;
  double dVar4;
  string local_70 [32];
  string local_50 [32];
  size_type *local_30;
  size_type *pos2_local;
  size_type *pos_local;
  double *val_local;
  string *in_local;
  
  local_30 = pos2;
  pos2_local = pos;
  pos_local = (size_type *)val;
  val_local = (double *)in;
  sVar2 = std::__cxx11::string::find((char)in,0x2c);
  *local_30 = sVar2;
  if (*local_30 == 0xffffffffffffffff) {
    sVar2 = std::__cxx11::string::size();
    pdVar1 = val_local;
    if (sVar2 == *pos2_local) {
      *pos_local = 0xbff0000000000000;
    }
    else {
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)local_70,(ulong)pdVar1);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      dVar4 = atof(pcVar3);
      *pos_local = (size_type)dVar4;
      std::__cxx11::string::~string(local_70);
    }
    in_local._4_4_ = 0;
  }
  else {
    if (*local_30 == *pos2_local) {
      *pos_local = 0xbff0000000000000;
    }
    else {
      std::__cxx11::string::substr((ulong)local_50,(ulong)val_local);
      pcVar3 = (char *)std::__cxx11::string::c_str();
      dVar4 = atof(pcVar3);
      *pos_local = (size_type)dVar4;
      std::__cxx11::string::~string(local_50);
    }
    *pos2_local = *local_30 + 1;
    in_local._4_4_ = 1;
  }
  return in_local._4_4_;
}

Assistant:

inline int GetNextRealNumber(std::string const& in, double& val,
                             std::string::size_type& pos,
                             std::string::size_type& pos2)
{
  pos2 = in.find(',', pos);
  if (pos2 != std::string::npos) {
    if (pos2 - pos == 0) {
      val = -1;
    } else {
      val = atof(in.substr(pos, pos2 - pos).c_str());
    }
    pos = pos2 + 1;
    return 1;
  }
  if (in.size() - pos == 0) {
    val = -1;
  } else {
    val = atof(in.substr(pos, in.size() - pos).c_str());
  }
  return 0;
}